

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nl-reader-test.cc
# Opt level: O1

void __thiscall NLReaderTest_ReadBoundsFirst_Test::TestBody(NLReaderTest_ReadBoundsFirst_Test *this)

{
  FunctionMocker<void_(const_mp::NLHeader_&)> *this_00;
  FunctionMocker<void_(int,_double,_double)> *this_01;
  FunctionMocker<void_(int,_mp::obj::Type,_BasicTestExpr<0>)> *this_02;
  MockSpec<void_(const_mp::NLHeader_&)> *this_03;
  MockSpec<void_(int,_double,_double)> *this_04;
  MockSpec<void_(int,_mp::obj::Type,_BasicTestExpr<0>)> *this_05;
  long *plVar1;
  mp *pmVar2;
  int in_R9D;
  NLStringRef str;
  InSequence dummy;
  NiceMock<MockNLHandler> handler;
  InSequence local_4c9;
  undefined1 local_4c8 [16];
  linked_ptr_internal local_4b8;
  long lStack_4b0;
  undefined1 local_4a8 [16];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_498;
  undefined1 local_488 [8];
  linked_ptr<const_testing::MatcherInterface<const_mp::NLHeader_&>_> local_480 [10];
  NLInfo_C local_3e0;
  NiceMock<MockNLHandler> local_378;
  
  testing::NiceMock<MockNLHandler>::NiceMock(&local_378);
  testing::InSequence::InSequence(&local_4c9);
  local_480[0].value_ = (MatcherInterface<const_mp::NLHeader_&> *)operator_new(8);
  ((local_480[0].value_)->super_MatcherDescriberInterface)._vptr_MatcherDescriberInterface =
       (_func_int **)&PTR__MatcherDescriberInterface_002f59e8;
  local_488 = (undefined1  [8])&PTR__MatcherBase_002f2c38;
  this_00 = &local_378.super_MockNLHandler.gmock1_OnHeader_64;
  local_480[0].link_.next_ = &local_480[0].link_;
  testing::internal::UntypedFunctionMockerBase::RegisterOwner
            ((UntypedFunctionMockerBase *)this_00,&local_378);
  this_03 = testing::internal::FunctionMocker<void_(const_mp::NLHeader_&)>::With
                      (this_00,(Matcher<const_mp::NLHeader_&> *)local_488);
  testing::internal::MockSpec<void_(const_mp::NLHeader_&)>::InternalExpectedAt
            (this_03,
             "/workspace/llm4binary/github/license_c_cmakelists/ampl[P]mp/test/nl-reader-test.cc",
             0x5ec,"handler","OnHeader(_)");
  local_488 = (undefined1  [8])&PTR__MatcherBase_002f2c80;
  testing::internal::linked_ptr<const_testing::MatcherInterface<const_mp::NLHeader_&>_>::~linked_ptr
            (local_480);
  testing::Matcher<int>::Matcher((Matcher<int> *)local_488,0);
  testing::Matcher<double>::Matcher((Matcher<double> *)local_4c8,1.0);
  testing::Matcher<double>::Matcher((Matcher<double> *)local_4a8,2.0);
  this_01 = &local_378.super_MockNLHandler.gmock3_OnVarBounds_65;
  testing::internal::UntypedFunctionMockerBase::RegisterOwner
            ((UntypedFunctionMockerBase *)this_01,&local_378);
  this_04 = testing::internal::FunctionMocker<void_(int,_double,_double)>::With
                      (this_01,(Matcher<int> *)local_488,(Matcher<double> *)local_4c8,
                       (Matcher<double> *)local_4a8);
  testing::internal::MockSpec<void_(int,_double,_double)>::InternalExpectedAt
            (this_04,
             "/workspace/llm4binary/github/license_c_cmakelists/ampl[P]mp/test/nl-reader-test.cc",
             0x5ed,"handler","OnVarBounds(0, 1, 2)");
  local_4a8._0_8_ = &PTR__MatcherBase_002f2ce8;
  testing::internal::linked_ptr<const_testing::MatcherInterface<double>_>::~linked_ptr
            ((linked_ptr<const_testing::MatcherInterface<double>_> *)(local_4a8 + 8));
  local_4c8._0_8_ = &PTR__MatcherBase_002f2ce8;
  testing::internal::linked_ptr<const_testing::MatcherInterface<double>_>::~linked_ptr
            ((linked_ptr<const_testing::MatcherInterface<double>_> *)(local_4c8 + 8));
  local_488 = (undefined1  [8])&PTR__MatcherBase_002f24e8;
  testing::internal::linked_ptr<const_testing::MatcherInterface<int>_>::~linked_ptr
            ((linked_ptr<const_testing::MatcherInterface<int>_> *)local_480);
  local_480[0].value_ = (MatcherInterface<const_mp::NLHeader_&> *)operator_new(8);
  ((local_480[0].value_)->super_MatcherDescriberInterface)._vptr_MatcherDescriberInterface =
       (_func_int **)&PTR__MatcherDescriberInterface_002f5460;
  local_488 = (undefined1  [8])&PTR__MatcherBase_002f24a0;
  local_480[0].link_.next_ = &local_480[0].link_;
  local_4c8._8_8_ = operator_new(8);
  (((MatcherInterface<double> *)local_4c8._8_8_)->super_MatcherDescriberInterface).
  _vptr_MatcherDescriberInterface = (_func_int **)&PTR__MatcherDescriberInterface_002f5c88;
  local_4c8._0_8_ = &PTR__MatcherBase_002f2d70;
  local_4b8.next_ = &local_4b8;
  local_4a8._8_8_ = operator_new(8);
  (((MatcherInterface<double> *)local_4a8._8_8_)->super_MatcherDescriberInterface).
  _vptr_MatcherDescriberInterface = (_func_int **)&PTR__MatcherDescriberInterface_002f5cf0;
  local_498._M_allocated_capacity = (size_type)&local_498;
  local_4a8._0_8_ = &PTR__MatcherBase_002f2d08;
  this_02 = &local_378.super_MockNLHandler.gmock3_OnObj_66;
  testing::internal::UntypedFunctionMockerBase::RegisterOwner
            ((UntypedFunctionMockerBase *)this_02,&local_378);
  this_05 = testing::internal::FunctionMocker<void_(int,_mp::obj::Type,_BasicTestExpr<0>)>::With
                      (this_02,(Matcher<int> *)local_488,(Matcher<mp::obj::Type> *)local_4c8,
                       (Matcher<BasicTestExpr<0>_> *)local_4a8);
  testing::internal::MockSpec<void_(int,_mp::obj::Type,_BasicTestExpr<0>)>::InternalExpectedAt
            (this_05,
             "/workspace/llm4binary/github/license_c_cmakelists/ampl[P]mp/test/nl-reader-test.cc",
             0x5ee,"handler","OnObj(_, _, _)");
  local_4a8._0_8_ = &PTR__MatcherBase_002f2d50;
  testing::internal::linked_ptr<const_testing::MatcherInterface<BasicTestExpr<0>_>_>::~linked_ptr
            ((linked_ptr<const_testing::MatcherInterface<BasicTestExpr<0>_>_> *)(local_4a8 + 8));
  local_4c8._0_8_ = &PTR__MatcherBase_002f2db8;
  testing::internal::linked_ptr<const_testing::MatcherInterface<mp::obj::Type>_>::~linked_ptr
            ((linked_ptr<const_testing::MatcherInterface<mp::obj::Type>_> *)(local_4c8 + 8));
  local_488 = (undefined1  [8])&PTR__MatcherBase_002f24e8;
  testing::internal::linked_ptr<const_testing::MatcherInterface<int>_>::~linked_ptr
            ((linked_ptr<const_testing::MatcherInterface<int>_> *)local_480);
  memset((NLHeader *)local_488,0,0x110);
  local_3e0.format = 1;
  local_3e0.num_ampl_options = 3;
  local_3e0.prob_name = "nl_instance";
  local_3e0.ampl_vbtol = 0.0;
  local_3e0.arith_kind = 1;
  local_3e0.flags = 1;
  local_3e0.ampl_options[3] = 0;
  local_3e0.ampl_options[4] = 0;
  local_3e0.ampl_options[5] = 0;
  local_3e0.ampl_options[6] = 0;
  local_3e0.ampl_options[7] = 0;
  local_3e0.ampl_options[8] = 0;
  local_3e0.ampl_options[2] = 0;
  local_3e0.ampl_options[0] = 1;
  local_3e0.ampl_options[1] = 1;
  local_480[0].value_ =
       (MatcherInterface<const_mp::NLHeader_&> *)CONCAT44(local_480[0].value_._4_4_,1);
  local_488._0_4_ = 1;
  FormatHeader_abi_cxx11_((string *)local_4a8,(NLHeader *)local_488,false);
  plVar1 = (long *)std::__cxx11::string::append(local_4a8);
  pmVar2 = (mp *)(plVar1 + 2);
  if ((mp *)*plVar1 == pmVar2) {
    local_4b8.next_ = *(linked_ptr_internal **)pmVar2;
    lStack_4b0 = plVar1[3];
    local_4c8._0_8_ = (mp *)&local_4b8;
  }
  else {
    local_4b8.next_ = *(linked_ptr_internal **)pmVar2;
    local_4c8._0_8_ = (mp *)*plVar1;
  }
  local_4c8._8_8_ = plVar1[1];
  *plVar1 = (long)pmVar2;
  plVar1[1] = 0;
  *(undefined1 *)(plVar1 + 2) = 0;
  str.size_ = (size_t)&local_378;
  str.data_ = (char *)local_4c8._8_8_;
  mp::ReadNLString<testing::NiceMock<MockNLHandler>>
            ((mp *)local_4c8._0_8_,str,(NiceMock<MockNLHandler> *)0x27bdaa,(CStringRef)0x1,in_R9D);
  if ((mp *)local_4c8._0_8_ != (mp *)&local_4b8) {
    operator_delete((void *)local_4c8._0_8_,(ulong)((long)&(local_4b8.next_)->next_ + 1));
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_4a8._0_8_ != &local_498) {
    operator_delete((void *)local_4a8._0_8_,(ulong)(local_498._M_allocated_capacity + 1));
  }
  testing::InSequence::~InSequence(&local_4c9);
  testing::NiceMock<MockNLHandler>::~NiceMock(&local_378);
  return;
}

Assistant:

TEST(NLReaderTest, ReadBoundsFirst) {
  testing::NiceMock<MockNLHandler> handler;
  testing::InSequence dummy;
  EXPECT_CALL(handler, OnHeader(_));
  EXPECT_CALL(handler, OnVarBounds(0, 1, 2));
  EXPECT_CALL(handler, OnObj(_, _, _));
  auto header = NLHeader();
  header.num_vars = header.num_objs = 1;
  ReadNLString(FormatHeader(header, false) + "O0 0\no2\nv0\nv0\nb\n0 1 2\n",
               handler, "", mp::READ_BOUNDS_FIRST);
}